

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall Assimp::OpenGEX::OpenGEXImporter::~OpenGEXImporter(OpenGEXImporter *this)

{
  long *plVar1;
  pointer ppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  long *plVar6;
  long lVar7;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008ca850;
  this->m_ctx = (Context *)0x0;
  std::
  vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ::~vector(&this->m_unresolvedRefStack);
  ppaVar2 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2,(long)(this->m_nodeStack).
                                  super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar2);
  }
  ppaVar3 = (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar3 != (pointer)0x0) {
    operator_delete(ppaVar3,(long)(this->m_lightCache).
                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar3);
  }
  ppaVar4 = (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar4 != (pointer)0x0) {
    operator_delete(ppaVar4,(long)(this->m_cameraCache).
                                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar4)
    ;
  }
  ppaVar5 = (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar5 != (pointer)0x0) {
    operator_delete(ppaVar5,(long)(this->m_materialCache).
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar5)
    ;
  }
  VertexContainer::~VertexContainer(&this->m_currentVertices);
  lVar7 = 0x1b8;
  do {
    plVar1 = (long *)((long)&(this->super_BaseImporter)._vptr_BaseImporter + lVar7);
    plVar6 = *(long **)((long)this + lVar7 + -0x10);
    if (plVar1 != plVar6) {
      operator_delete(plVar6,*plVar1 + 1);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != 0x118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_material2refMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_mesh2refMap)._M_t);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::~vector(&this->m_meshCache);
  std::
  _Rb_tree<aiNode_*,_std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>,_std::_Select1st<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
  ::~_Rb_tree(&(this->m_nodeChildMap)._M_t);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

OpenGEXImporter::~OpenGEXImporter() {
    m_ctx = nullptr;
}